

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers_test.cpp
# Opt level: O1

void __thiscall
SobolUnscrambledSampler_ElementaryIntervals_Test::TestBody
          (SobolUnscrambledSampler_ElementaryIntervals_Test *this)

{
  SobolSampler *this_00;
  int res;
  uint logSamples;
  uintptr_t iptr;
  SamplerHandle local_40;
  Tuple2<pbrt::Point2,_int> local_38;
  
  logSamples = 2;
  do {
    this_00 = (SobolSampler *)operator_new(0x20);
    local_38.x = 1;
    local_38.y = 1;
    res = 0;
    pbrt::SobolSampler::SobolSampler(this_00,1 << (logSamples & 0x1f),(Point2i *)&local_38,None);
    local_40.
    super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
    .bits = (TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
             )((ulong)this_00 | 0x5000000000000);
    checkElementarySampler("Sobol Unscrambled",&local_40,logSamples,res);
    logSamples = logSamples + 1;
  } while (logSamples != 0xb);
  return;
}

Assistant:

TEST(SobolUnscrambledSampler, ElementaryIntervals) {
    for (int logSamples = 2; logSamples <= 10; ++logSamples)
        checkElementarySampler(
            "Sobol Unscrambled",
            new SobolSampler(1 << logSamples, Point2i(1, 1), RandomizeStrategy::None),
            logSamples);
}